

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::EventImport::~EventImport(EventImport *this)

{
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__EventImport_00199b40;
  Event::~Event(&this->event);
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit EventImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Event>(), event(name) {}